

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O1

int Sfm_TimCriticalPath(Sfm_Tim_t *p,int Window)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Obj_t *pObj;
  int *piVar3;
  uint uVar4;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  iVar1 = p->Delay;
  (p->vPath).nSize = 0;
  pAVar2 = p->pNtk;
  if ((pAVar2->vTravIds).pArray == (int *)0x0) {
    iVar8 = pAVar2->vObjs->nSize;
    uVar7 = (long)iVar8 + 500;
    iVar9 = (int)uVar7;
    if ((pAVar2->vTravIds).nCap < iVar9) {
      piVar5 = (int *)malloc(uVar7 * 4);
      (pAVar2->vTravIds).pArray = piVar5;
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar2->vTravIds).nCap = iVar9;
    }
    if (-500 < iVar8) {
      memset((pAVar2->vTravIds).pArray,0,(uVar7 & 0xffffffff) << 2);
    }
    (pAVar2->vTravIds).nSize = iVar9;
  }
  iVar8 = pAVar2->nTravIds;
  pAVar2->nTravIds = iVar8 + 1;
  if (0x3ffffffe < iVar8) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar6 = p->pNtk->vCos;
  if (0 < pVVar6->nSize) {
    iVar1 = (Window * iVar1) / 100;
    lVar10 = 0;
    do {
      pObj = *(Abc_Obj_t **)
              (*(long *)(*(long *)(*pVVar6->pArray[lVar10] + 0x20) + 8) +
              (long)**(int **)((long)pVVar6->pArray[lVar10] + 0x20) * 8);
      uVar4 = *(uint *)&pObj->field_0x14 & 0xf;
      if (((uVar4 != 2) && (uVar4 != 5)) && ((pObj->vFanins).nSize != 0)) {
        if (uVar4 != 7) {
          __assert_fail("Abc_ObjIsNode(pNext)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmTim.c"
                        ,0xb7,"int Sfm_TimCriticalPath(Sfm_Tim_t *, int)");
        }
        uVar4 = pObj->Id;
        uVar7 = (ulong)uVar4;
        if ((int)uVar4 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        if (((p->vTimReqs).nSize <= (int)(uVar4 * 2)) || ((p->vTimArrs).nSize <= (int)(uVar4 * 2)))
        {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar5 = (p->vTimArrs).pArray;
        piVar3 = (p->vTimReqs).pArray;
        iVar9 = piVar3[uVar7 * 2] - piVar5[uVar7 * 2];
        iVar8 = piVar3[uVar7 * 2 + 1] - piVar5[uVar7 * 2 + 1];
        if (iVar9 < iVar8) {
          iVar8 = iVar9;
        }
        if (iVar8 <= iVar1) {
          Sfm_TimCriticalPath_int(p,pObj,&p->vPath,iVar1);
        }
      }
      lVar10 = lVar10 + 1;
      pVVar6 = p->pNtk->vCos;
    } while (lVar10 < pVVar6->nSize);
  }
  return (p->vPath).nSize;
}

Assistant:

int Sfm_TimCriticalPath( Sfm_Tim_t * p, int Window )
{
    int i, SlackMax = p->Delay * Window / 100;
    Abc_Obj_t * pObj, * pNext; 
    Vec_IntClear( &p->vPath );
    Abc_NtkIncrementTravId( p->pNtk ); 
    Abc_NtkForEachCo( p->pNtk, pObj, i )
    {
        pNext = Abc_ObjFanin0(pObj);
        if ( Abc_ObjIsCi(pNext) || Abc_ObjFaninNum(pNext) == 0 )
            continue;
        assert( Abc_ObjIsNode(pNext) );
        if ( Sfm_TimSlack(p, pNext) <= SlackMax )
            Sfm_TimCriticalPath_int( p, pNext, &p->vPath, SlackMax );
    }
    return Vec_IntSize(&p->vPath);
}